

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O1

void __thiscall
OSTEI_VRR_Algorithm_Base::Create_WithOrder
          (OSTEI_VRR_Algorithm_Base *this,QuartetSet *q,IdxOrder idx_order)

{
  Quartet *this_00;
  VRR_IntReqMap *this_01;
  int *__v;
  int *__v_00;
  RRStepType rrstep;
  _Rb_tree_color _Var1;
  int iVar2;
  int iVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  const_iterator cVar6;
  _Rb_tree<VRRStep,VRRStep,std::_Identity<VRRStep>,std::less<VRRStep>,std::allocator<VRRStep>>
  *p_Var7;
  _Rb_tree_node_base *p_Var8;
  VRR_MReqMap *this_02;
  mapped_type *pmVar9;
  _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
  *this_03;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *p_Var10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_color _Var12;
  _Rb_tree_header *p_Var13;
  long lVar14;
  OSTEI_VRR_Algorithm_Base *pOVar15;
  Quartet *this_04;
  undefined1 *puVar16;
  long lVar17;
  _Rb_tree_node_base *__v_01;
  QuartetSet my_targets;
  QuartetSet newtargets;
  QAM qam;
  QuartetSet solvedquartets;
  QuartetSet qnew;
  VRR_StepMap newmap;
  QuartetSet not_for_me;
  undefined1 local_8e8 [16];
  _Alloc_hider local_8d8;
  _Rb_tree_node_base *local_8d0;
  undefined1 local_8c8 [24];
  undefined1 local_8b0 [16];
  _Alloc_hider local_8a0;
  _Base_ptr local_898;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_890;
  QAM local_880;
  _Base_ptr local_850;
  _Base_ptr local_848;
  undefined1 local_840 [16];
  pointer local_830;
  pointer local_828;
  undefined1 local_820 [16];
  _Alloc_hider local_810;
  pointer local_808;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_800;
  _Rb_tree_node_base *local_7f0;
  undefined1 local_7e8 [24];
  pointer local_7d0;
  _Alloc_hider _Stack_7c8;
  _Base_ptr local_7c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b8;
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  local_7a8;
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  local_778;
  _Rb_tree<QAM,_std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>,_std::_Select1st<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
  local_748;
  undefined1 local_718 [32];
  _Alloc_hider local_6f8;
  _Rb_tree_node_base local_6e8;
  int iStack_6c8;
  int iStack_6c4;
  int iStack_6c0;
  _Alloc_hider local_6b8;
  char local_6a8 [16];
  _Rb_tree_color local_698;
  _Alloc_hider local_690;
  char local_680 [24];
  undefined1 local_668 [48];
  undefined1 local_638 [8];
  undefined1 auStack_630 [8];
  _Alloc_hider local_628;
  _Rb_tree_const_iterator<Quartet> _Stack_620;
  undefined1 auStack_618 [16];
  _Rb_tree_node_base local_608;
  _Alloc_hider local_5d8;
  _Alloc_hider local_5d0;
  char local_5c8 [8];
  _Rb_tree_node_base local_5c0;
  undefined1 local_5a0 [8];
  char local_598 [1344];
  undefined1 local_58 [40];
  
  local_7b8._8_8_ = idx_order._M_elems._8_8_;
  local_7b8._M_allocated_capacity = idx_order._M_elems._0_8_;
  local_778._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_778._M_impl.super__Rb_tree_header._M_header;
  local_778._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_778._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_778._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var5 = (q->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var13 = &(q->_M_t)._M_impl.super__Rb_tree_header;
  local_778._M_impl.super__Rb_tree_header._M_header._M_right =
       local_778._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var5 != p_Var13) {
    do {
      Quartet::notag((Quartet *)local_638,(Quartet *)(p_Var5 + 1));
      std::
      _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
      ::_M_insert_unique<Quartet>(&local_778,(Quartet *)local_638);
      if ((undefined1 *)CONCAT44(local_5c0._M_left._4_4_,(int)local_5c0._M_left) != local_5a0) {
        operator_delete((undefined1 *)CONCAT44(local_5c0._M_left._4_4_,(int)local_5c0._M_left));
      }
      if (local_5d8._M_p != local_5c8) {
        operator_delete(local_5d8._M_p);
      }
      if ((_Rb_tree_node_base *)auStack_618._0_8_ != &local_608) {
        operator_delete((void *)auStack_618._0_8_);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var13);
  }
  local_748._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_748._M_impl.super__Rb_tree_header._M_header;
  local_748._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_748._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_748._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_7a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_7a8._M_impl.super__Rb_tree_header._M_header;
  local_7a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_7a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_7a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  pOVar15 = (OSTEI_VRR_Algorithm_Base *)local_7e8;
  local_7a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_7a8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_748._M_impl.super__Rb_tree_header._M_header._M_right =
       local_748._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  ::_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
              *)pOVar15,&local_778);
  PruneQuartets_(pOVar15,(QuartetSet *)local_7e8);
  lVar17 = 0;
  do {
    rrstep = *(RRStepType *)((long)&local_7b8 + lVar17 * 4);
    if ((int)rrstep < 0) break;
    pOVar15 = (OSTEI_VRR_Algorithm_Base *)local_7e8;
    std::
    _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
    ::_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                *)local_8e8,
               (_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                *)pOVar15);
    PruneQuartets_((QuartetSet *)local_638,pOVar15,(QuartetSet *)local_8e8,rrstep);
    std::
    _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
    ::clear((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
             *)local_7e8);
    if ((pointer)local_628._M_p != (pointer)0x0) {
      local_7e8._8_4_ = auStack_630._0_4_;
      local_7e8._16_8_ = local_628._M_p;
      local_7d0 = (pointer)_Stack_620._M_node;
      _Stack_7c8._M_p = (pointer)auStack_618._0_8_;
      *(undefined1 **)(local_628._M_p + 8) = local_7e8 + 8;
      local_7c0 = (_Base_ptr)auStack_618._8_8_;
      local_628._M_p = (pointer)0x0;
      _Stack_620._M_node = (_Base_ptr)auStack_630;
      auStack_618._8_8_ = (undefined1 *)0x0;
      auStack_618._0_8_ = _Stack_620._M_node;
    }
    std::
    _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
    ::~_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                 *)local_638);
    p_Var8 = local_8d0;
    while (local_8d0 = p_Var8, (_Base_ptr)local_8c8._8_8_ != (_Base_ptr)0x0) {
      local_8b0._8_4_ = _S_red;
      local_8a0._M_p = (pointer)0x0;
      local_898 = (_Base_ptr)(local_8b0 + 8);
      local_890._8_8_ = 0;
      local_890._M_allocated_capacity = (size_type)local_898;
      while( true ) {
        if (p_Var8 == (_Rb_tree_node_base *)(local_8e8 + 8)) break;
        this_00 = (Quartet *)(p_Var8 + 1);
        Quartet::amlist(&local_880,this_00);
        local_718._0_4_ = (this_00->bra).type;
        local_718._4_4_ = *(undefined4 *)&p_Var8[1].field_0x4;
        local_718._8_4_ = *(undefined4 *)&p_Var8[1]._M_parent;
        local_718._12_4_ = *(int *)((long)&p_Var8[1]._M_parent + 4);
        local_718._16_4_ = *(undefined4 *)&p_Var8[1]._M_left;
        local_718._20_4_ = *(int *)((long)&p_Var8[1]._M_left + 4);
        local_718._24_4_ = *(undefined4 *)&p_Var8[1]._M_right;
        local_6f8._M_p = (pointer)&local_6e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6f8,*(long *)(p_Var8 + 2),
                   (long)&(p_Var8[2]._M_parent)->_M_color + *(long *)(p_Var8 + 2));
        local_6e8._M_left._0_4_ = p_Var8[3]._M_color;
        local_6e8._M_left._4_4_ = *(int *)&p_Var8[3].field_0x4;
        local_6e8._M_right._0_4_ = *(_Rb_tree_color *)&p_Var8[3]._M_parent;
        local_6e8._M_right._4_4_ = *(int *)((long)&p_Var8[3]._M_parent + 4);
        iStack_6c8 = *(int *)&p_Var8[3]._M_left;
        iStack_6c4 = *(int *)((long)&p_Var8[3]._M_left + 4);
        iStack_6c0 = *(int *)&p_Var8[3]._M_right;
        local_6b8._M_p = local_6a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6b8,*(long *)(p_Var8 + 4),
                   (long)&(p_Var8[4]._M_parent)->_M_color + *(long *)(p_Var8 + 4));
        local_698 = p_Var8[5]._M_color;
        local_690._M_p = local_680;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_690,p_Var8[5]._M_parent,
                   (long)&(p_Var8[5]._M_parent)->_M_color + (long)&(p_Var8[5]._M_left)->_M_color);
        Create_Single_((VRRStep *)local_638,this,(Quartet *)local_718,rrstep);
        if (local_690._M_p != local_680) {
          operator_delete(local_690._M_p);
        }
        if (local_6b8._M_p != local_6a8) {
          operator_delete(local_6b8._M_p);
        }
        if ((_Rb_tree_node_base *)local_6f8._M_p != &local_6e8) {
          operator_delete(local_6f8._M_p);
        }
        lVar14 = 0xb0;
        do {
          this_04 = (Quartet *)(local_638 + lVar14);
          bVar4 = Quartet::operator_cast_to_bool(this_04);
          if ((bVar4) &&
             (cVar6 = std::
                      _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                      ::find(&local_7a8,this_04),
             (_Rb_tree_header *)cVar6._M_node == &local_7a8._M_impl.super__Rb_tree_header)) {
            std::
            _Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
            ::_M_insert_unique<Quartet_const&>
                      ((_Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
                        *)local_8b0,this_04);
          }
          lVar14 = lVar14 + 0xa8;
        } while (lVar14 != 0x5f0);
        p_Var7 = (_Rb_tree<VRRStep,VRRStep,std::_Identity<VRRStep>,std::less<VRRStep>,std::allocator<VRRStep>>
                  *)std::
                    map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
                    ::operator[]((map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
                                  *)&local_748,&local_880);
        std::
        _Rb_tree<VRRStep,VRRStep,std::_Identity<VRRStep>,std::less<VRRStep>,std::allocator<VRRStep>>
        ::_M_insert_unique<VRRStep_const&>(p_Var7,(VRRStep *)local_638);
        std::
        _Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
        ::_M_insert_unique<Quartet_const&>
                  ((_Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
                    *)&local_7a8,this_00);
        lVar14 = -0x540;
        puVar16 = local_58;
        do {
          if (puVar16 != *(undefined1 **)(puVar16 + -0x10)) {
            operator_delete(*(undefined1 **)(puVar16 + -0x10));
          }
          if (puVar16 + -0x28 != *(undefined1 **)(puVar16 + -0x38)) {
            operator_delete(*(undefined1 **)(puVar16 + -0x38));
          }
          if (puVar16 + -0x68 != *(undefined1 **)(puVar16 + -0x78)) {
            operator_delete(*(undefined1 **)(puVar16 + -0x78));
          }
          puVar16 = puVar16 + -0xa8;
          lVar14 = lVar14 + 0xa8;
        } while (lVar14 != 0);
        if (local_5c0._M_right != (_Base_ptr)local_598) {
          operator_delete(local_5c0._M_right);
        }
        if ((_Rb_tree_node_base *)local_5d0._M_p != &local_5c0) {
          operator_delete(local_5d0._M_p);
        }
        if ((_Base_ptr *)auStack_618._8_8_ != &local_608._M_parent) {
          operator_delete((void *)auStack_618._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_880.tag._M_dataplus._M_p != &local_880.tag.field_2) {
          operator_delete(local_880.tag._M_dataplus._M_p);
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      }
      pOVar15 = (OSTEI_VRR_Algorithm_Base *)local_8b0;
      std::
      _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
      ::operator=((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                   *)local_8e8,
                  (_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                   *)pOVar15);
      PruneQuartets_((QuartetSet *)local_638,pOVar15,(QuartetSet *)local_8e8,rrstep);
      std::
      _Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>::
      _M_insert_range_unique<std::_Rb_tree_const_iterator<Quartet>>
                ((_Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
                  *)local_7e8,_Stack_620,(_Base_ptr)auStack_630);
      std::
      _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
      ::~_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                   *)local_638);
      std::
      _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
      ::~_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                   *)local_8b0);
      p_Var8 = local_8d0;
    }
    std::
    _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
    ::~_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                 *)local_8e8);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 4);
  if ((_Rb_tree_header *)local_7a8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_7a8._M_impl.super__Rb_tree_header) {
    p_Var5 = local_7a8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      Quartet::amlist((QAM *)local_638,(Quartet *)(p_Var5 + 1));
      std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::
      _M_insert_unique<QAM>(&(this->allam_)._M_t,(QAM *)local_638);
      if ((pointer)local_628._M_p != (pointer)auStack_618) {
        operator_delete(local_628._M_p);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_7a8._M_impl.super__Rb_tree_header);
  }
  local_810._M_p = (pointer)&local_800;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"");
  local_638 = (undefined1  [8])0x0;
  auStack_630 = (undefined1  [8])0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_p == &local_800) {
    auStack_618._8_8_ = local_800._8_8_;
    local_628._M_p = (pointer)auStack_618;
  }
  else {
    local_628._M_p = local_810._M_p;
  }
  _Stack_620._M_node = (_Base_ptr)local_808;
  local_808 = (pointer)0x0;
  local_800._M_local_buf[0] = '\0';
  local_810._M_p = (pointer)&local_800;
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::
  _M_insert_unique<QAM>(&(this->allam_)._M_t,(QAM *)local_638);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_618) {
    operator_delete(local_628._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_p != &local_800) {
    operator_delete(local_810._M_p);
  }
  local_830 = (pointer)local_820;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"");
  this_02 = &this->vrrmreq_max_;
  local_638 = (undefined1  [8])0x0;
  auStack_630 = (undefined1  [8])0x0;
  local_628._M_p = auStack_618;
  if (local_830 == (pointer)local_820) {
    auStack_618._8_8_ = local_820._8_8_;
  }
  else {
    local_628._M_p = (pointer)local_830;
  }
  _Stack_620._M_node = (_Base_ptr)local_828;
  local_828 = (pointer)0x0;
  local_820[0] = 0;
  local_830 = (pointer)local_820;
  pmVar9 = std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>::
           operator[](this_02,(key_type *)local_638);
  *pmVar9 = 0;
  if ((pointer)local_628._M_p != (pointer)auStack_618) {
    operator_delete(local_628._M_p);
  }
  if (local_830 != (pointer)local_820) {
    operator_delete(local_830);
  }
  if ((_Rb_tree_header *)local_748._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_748._M_impl.super__Rb_tree_header) {
    p_Var5 = local_748._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::
      _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
      ::_Rb_tree((_Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
                  *)local_8e8,
                 (_Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
                  *)&p_Var5[2]._M_left);
      if (local_8d0 != (_Rb_tree_node_base *)(local_8e8 + 8)) {
        p_Var8 = local_8d0;
        do {
          VRRStep::VRRStep((VRRStep *)local_638,(VRRStep *)(p_Var8 + 1));
          iVar3 = (int)local_5c0._M_left;
          Quartet::amlist((QAM *)local_8b0,(Quartet *)auStack_630);
          pmVar9 = std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>::
                   operator[](this_02,(QAM *)local_8b0);
          iVar2 = *pmVar9;
          if (*pmVar9 < iVar3) {
            iVar2 = iVar3;
          }
          Quartet::amlist(&local_880,(Quartet *)auStack_630);
          pmVar9 = std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>::
                   operator[](this_02,&local_880);
          *pmVar9 = iVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_880.tag._M_dataplus._M_p != &local_880.tag.field_2) {
            operator_delete(local_880.tag._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8a0._M_p != &local_890) {
            operator_delete(local_8a0._M_p);
          }
          local_5c0._M_left._0_4_ = 0;
          lVar17 = 0xb0;
          do {
            Quartet::amlist((QAM *)local_8b0,(Quartet *)(local_638 + lVar17));
            pmVar9 = std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>
                     ::operator[](this_02,(QAM *)local_8b0);
            iVar2 = *pmVar9;
            if (*pmVar9 < *(int *)(local_5a0 + lVar17 + -0x18)) {
              iVar2 = *(int *)(local_5a0 + lVar17 + -0x18);
            }
            Quartet::amlist(&local_880,(Quartet *)(local_638 + lVar17));
            pmVar9 = std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>
                     ::operator[](this_02,&local_880);
            *pmVar9 = iVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_880.tag._M_dataplus._M_p != &local_880.tag.field_2) {
              operator_delete(local_880.tag._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8a0._M_p != &local_890) {
              operator_delete(local_8a0._M_p);
            }
            *(int *)(local_5a0 + lVar17 + -0x18) = *(int *)(local_5a0 + lVar17 + -0x18) - iVar3;
            lVar17 = lVar17 + 0xa8;
          } while (lVar17 != 0x5f0);
          p_Var7 = (_Rb_tree<VRRStep,VRRStep,std::_Identity<VRRStep>,std::less<VRRStep>,std::allocator<VRRStep>>
                    *)std::
                      map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
                      ::operator[](&this->vrrmap_,(key_type *)(p_Var5 + 1));
          std::
          _Rb_tree<VRRStep,VRRStep,std::_Identity<VRRStep>,std::less<VRRStep>,std::allocator<VRRStep>>
          ::_M_insert_unique<VRRStep_const&>(p_Var7,(VRRStep *)local_638);
          lVar17 = -0x540;
          puVar16 = local_58;
          do {
            if (puVar16 != *(undefined1 **)(puVar16 + -0x10)) {
              operator_delete(*(undefined1 **)(puVar16 + -0x10));
            }
            if (puVar16 + -0x28 != *(undefined1 **)(puVar16 + -0x38)) {
              operator_delete(*(undefined1 **)(puVar16 + -0x38));
            }
            if (puVar16 + -0x68 != *(undefined1 **)(puVar16 + -0x78)) {
              operator_delete(*(undefined1 **)(puVar16 + -0x78));
            }
            puVar16 = puVar16 + -0xa8;
            lVar17 = lVar17 + 0xa8;
          } while (lVar17 != 0);
          if (local_5c0._M_right != (_Base_ptr)local_598) {
            operator_delete(local_5c0._M_right);
          }
          if ((_Rb_tree_node_base *)local_5d0._M_p != &local_5c0) {
            operator_delete(local_5d0._M_p);
          }
          if ((_Base_ptr *)auStack_618._8_8_ != &local_608._M_parent) {
            operator_delete((void *)auStack_618._8_8_);
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != (_Rb_tree_node_base *)(local_8e8 + 8));
      }
      std::
      _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
      ::~_Rb_tree((_Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
                   *)local_8e8);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_748._M_impl.super__Rb_tree_header);
  }
  local_628._M_p = (pointer)0x0;
  local_638 = (undefined1  [8])0x0;
  auStack_630 = (undefined1  [8])0x0;
  _Stack_620._M_node = (_Base_ptr)auStack_630;
  auStack_618._8_8_ = 0;
  local_850 = (_Base_ptr)local_840;
  auStack_618._0_8_ = _Stack_620._M_node;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_850,"");
  local_8e8._0_8_ = 0;
  local_8e8._8_8_ = 0;
  if (local_850 == (_Base_ptr)local_840) {
    local_8c8._8_8_ = local_840._8_8_;
    local_8d8._M_p = (pointer)local_8c8;
  }
  else {
    local_8d8._M_p = (pointer)local_850;
  }
  local_8d0 = local_848;
  local_848 = (_Base_ptr)0x0;
  local_840[0] = _S_red;
  local_850 = (_Base_ptr)local_840;
  this_03 = &std::
             map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
             ::operator[](&this->vrrmap_,(key_type *)local_8e8)->_M_t;
  std::
  _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
  ::clear(this_03);
  if ((pointer)local_628._M_p != (pointer)0x0) {
    (this_03->_M_impl).super__Rb_tree_header._M_header._M_color = auStack_630._0_4_;
    (this_03->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_628._M_p;
    (this_03->_M_impl).super__Rb_tree_header._M_header._M_left = _Stack_620._M_node;
    (this_03->_M_impl).super__Rb_tree_header._M_header._M_right = (_Base_ptr)auStack_618._0_8_;
    *(_Rb_tree_header **)(local_628._M_p + 8) = &(this_03->_M_impl).super__Rb_tree_header;
    (this_03->_M_impl).super__Rb_tree_header._M_node_count = auStack_618._8_8_;
    local_628._M_p = (pointer)0x0;
    _Stack_620._M_node = (_Base_ptr)auStack_630;
    auStack_618._8_8_ = 0;
    auStack_618._0_8_ = _Stack_620._M_node;
  }
  if ((_Base_ptr)local_8d8._M_p != (_Base_ptr)local_8c8) {
    operator_delete(local_8d8._M_p);
  }
  if (local_850 != (_Base_ptr)local_840) {
    operator_delete(local_850);
  }
  std::
  _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
  ::~_Rb_tree((_Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
               *)local_638);
  this->maxint_ = 0;
  p_Var8 = (this->vrrmap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_7f0 = &(this->vrrmap_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var8 != local_7f0) {
    this_01 = &this->qamint_2pq_;
    do {
      local_628._M_p = auStack_618;
      local_638 = *(undefined1 (*) [8])(p_Var8 + 1);
      auStack_630 = (undefined1  [8])p_Var8[1]._M_parent;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_628,p_Var8[1]._M_left,
                 (long)&(p_Var8[1]._M_left)->_M_color + (long)&(p_Var8[1]._M_right)->_M_color);
      for (p_Var11 = p_Var8[3]._M_parent; p_Var11 != (_Rb_tree_node_base *)&p_Var8[2]._M_right;
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
        __v = (int *)((long)&p_Var11[0x30]._M_left + 4);
        _Var1 = *(_Rb_tree_color *)((long)&p_Var11[0x30]._M_left + 4);
        _Var12 = this->maxint_;
        if (this->maxint_ < (int)_Var1) {
          _Var12 = _Var1;
        }
        this->maxint_ = _Var12;
        __v_01 = (_Rb_tree_node_base *)&p_Var11[0x30]._M_right;
        if ((int)_Var12 < (int)*(_Rb_tree_color *)&p_Var11[0x30]._M_right) {
          _Var12 = *(_Rb_tree_color *)&p_Var11[0x30]._M_right;
        }
        this->maxint_ = _Var12;
        __v_00 = (int *)((long)&p_Var11[0x30]._M_right + 4);
        _Var1 = *(_Rb_tree_color *)((long)&p_Var11[0x30]._M_right + 4);
        if ((int)_Var12 < (int)_Var1) {
          _Var12 = _Var1;
        }
        this->maxint_ = _Var12;
        if ((int)_Var12 < (int)p_Var11[0x31]._M_color) {
          _Var12 = p_Var11[0x31]._M_color;
        }
        this->maxint_ = _Var12;
        if (p_Var11[1]._M_color < 2) {
          bVar4 = Quartet::operator_cast_to_bool((Quartet *)(p_Var11 + 0x11));
          if ((bVar4) ||
             (bVar4 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x16]._M_parent), bVar4)) {
            p_Var10 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      std::
                      map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      ::operator[](&this->qamint_2p_,(key_type *)local_638);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(p_Var10,__v);
          }
          bVar4 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x1b]._M_left);
          if ((bVar4) ||
             (bVar4 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x20]._M_right), bVar4)) {
            p_Var10 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      std::
                      map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      ::operator[](&this->qamint_2p_,(key_type *)local_638);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(p_Var10,(int *)__v_01);
          }
          bVar4 = Quartet::operator_cast_to_bool((Quartet *)(p_Var11 + 0x26));
          if (bVar4) {
            p_Var10 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      std::
                      map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      ::operator[](this_01,(key_type *)local_638);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(p_Var10,__v_00);
          }
          bVar4 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x2b]._M_parent);
          if (bVar4) {
            p_Var10 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      std::
                      map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      ::operator[](this_01,(key_type *)local_638);
            __v_01 = p_Var11 + 0x31;
LAB_0010fb60:
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(p_Var10,(int *)__v_01);
          }
        }
        else {
          bVar4 = Quartet::operator_cast_to_bool((Quartet *)(p_Var11 + 0x11));
          if ((bVar4) ||
             (bVar4 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x16]._M_parent), bVar4)) {
            p_Var10 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      std::
                      map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      ::operator[](&this->qamint_2q_,(key_type *)local_638);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(p_Var10,__v_00);
          }
          bVar4 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x1b]._M_left);
          if ((bVar4) ||
             (bVar4 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x20]._M_right), bVar4)) {
            p_Var10 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      std::
                      map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      ::operator[](&this->qamint_2q_,(key_type *)local_638);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(p_Var10,(int *)(p_Var11 + 0x31));
          }
          bVar4 = Quartet::operator_cast_to_bool((Quartet *)(p_Var11 + 0x26));
          if (bVar4) {
            p_Var10 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      std::
                      map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      ::operator[](this_01,(key_type *)local_638);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(p_Var10,__v);
          }
          bVar4 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x2b]._M_parent);
          if (bVar4) {
            p_Var10 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      std::
                      map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      ::operator[](this_01,(key_type *)local_638);
            goto LAB_0010fb60;
          }
        }
      }
      if ((pointer)local_628._M_p != (pointer)auStack_618) {
        operator_delete(local_628._M_p);
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != local_7f0);
  }
  if ((_Rb_tree_header *)local_778._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_778._M_impl.super__Rb_tree_header) {
    p_Var5 = local_778._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      Quartet::amlist((QAM *)local_668,(Quartet *)(p_Var5 + 1));
      AMOrder_AddWithDependencies_(this,&this->amorder_,(QAM *)local_668);
      if ((_Base_ptr)local_668._16_8_ != (_Base_ptr)(local_668 + 0x20)) {
        operator_delete((void *)local_668._16_8_);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_778._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  ::~_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
               *)local_7e8);
  std::
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  ::~_Rb_tree(&local_7a8);
  std::
  _Rb_tree<QAM,_std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>,_std::_Select1st<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
  ::~_Rb_tree(&local_748);
  std::
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  ::~_Rb_tree(&local_778);
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::Create_WithOrder(const QuartetSet & q, IdxOrder idx_order)
{
    // holds the requirements for each am
    // so store what we initially want
    //PrintQuartetSet(q, "Initial VRR");

    // strip off the tags. They don't mean anything in VRR
    QuartetSet qnew;
    for(auto & it : q)
        qnew.insert(it.notag());


    VRR_StepMap newmap;

    // solved quartets
    QuartetSet solvedquartets;

    // unsolved quartets
    QuartetSet targets = qnew;
    PruneQuartets_(targets);

    for(int i = 0; i < 4; i++)
    {
        // check if we should stop
        if(idx_order[i] < 0)
            break;

        RRStepType rrstep = static_cast<RRStepType>(idx_order[i]);

        QuartetSet my_targets = targets;

        // set targets to be everything we aren't doing 
        targets = PruneQuartets_(my_targets, rrstep);

        while(my_targets.size())
        {
            QuartetSet newtargets;

            for(const auto & it : my_targets)
            {
                QAM qam = it.amlist();

                VRRStep vs = Create_Single_(it, rrstep);

                // add new targets
                for(const auto & it2 : vs.src)
                {
                    if(it2)
                    {
                        if(solvedquartets.count(it2) == 0)
                            newtargets.insert(it2);
                    }
                }

                newmap[qam].insert(vs);
                solvedquartets.insert(it);
            }

            // now get what I need to do
            my_targets = newtargets;
            QuartetSet not_for_me = PruneQuartets_(my_targets, rrstep);

            // add anything that is not my responsibility to the
            // main targets list. These might not be a part of
            // that list right now. 
            targets.insert(not_for_me.begin(),
                           not_for_me.end());
        }
    } 

    // save the solved quartets
    for(const auto & it : solvedquartets)
        allam_.insert(it.amlist());
    allam_.insert({0,0,0,0});

    // and we must do at least (s s | s s)^0
    vrrmreq_max_[{0,0,0,0}] = 0;

    // Handle the needed m values
    // For now, add all to the zero m value
    // but store the max m values needed
    for(auto & it : newmap)
    {
        VRR_StepSet vs = it.second;

        // notice it2 is a copy
        for(auto it2 : vs)
        {
            int m = it2.target.m;

            vrrmreq_max_[it2.target.amlist()] = std::max(m, vrrmreq_max_[it2.target.amlist()]);

            it2.target.m = 0;
            for(auto & mit : it2.src)
            {
                vrrmreq_max_[mit.amlist()] = std::max(mit.m, vrrmreq_max_[mit.amlist()]);
                mit.m -= m;
            }
   
            vrrmap_[it.first].insert(it2);
        } 
    }


    // and empty step list for s s s s
    vrrmap_[{0,0,0,0}] = VRR_StepSet();

    // determine requirements for all QAM
    // and the maximum integer constant
    maxint_ = 0;
    for(const auto & it : vrrmap_) // for all QAM
    {
        QAM qam = it.first;

        for(const auto & its : it.second)  // for all steps for this QAM
        {
            maxint_ = std::max(its.ijkl[0], maxint_);
            maxint_ = std::max(its.ijkl[1], maxint_);
            maxint_ = std::max(its.ijkl[2], maxint_);
            maxint_ = std::max(its.ijkl[3], maxint_);

            if(its.type == RRStepType::I || its.type == RRStepType::J)
            {
                if(its.src[2] || its.src[3])
                    qamint_2p_[qam].insert(its.ijkl[0]);

                if(its.src[4] || its.src[5])
                    qamint_2p_[qam].insert(its.ijkl[1]);

                if(its.src[6])
                    qamint_2pq_[qam].insert(its.ijkl[2]);

                if(its.src[7])
                    qamint_2pq_[qam].insert(its.ijkl[3]);
            }
            else
            {
                if(its.src[2] || its.src[3])
                    qamint_2q_[qam].insert(its.ijkl[2]);

                if(its.src[4] || its.src[5])
                    qamint_2q_[qam].insert(its.ijkl[3]);

                if(its.src[6])
                    qamint_2pq_[qam].insert(its.ijkl[0]);

                if(its.src[7])
                    qamint_2pq_[qam].insert(its.ijkl[1]);
            }
        }
    }


    // order the AM
    for(const auto & it : qnew) 
        AMOrder_AddWithDependencies_(amorder_, it.amlist());

}